

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

void __thiscall asl::Var::operator=(Var *this,char *x)

{
  size_t sVar1;
  Array<char> *pAVar2;
  char *pcVar3;
  Array<char> local_28;
  int local_1c;
  char *pcStack_18;
  int n;
  char *x_local;
  Var *this_local;
  
  pcStack_18 = x;
  x_local = (char *)this;
  sVar1 = strlen(x);
  local_1c = (int)sVar1;
  if (this->_type == STRING) {
    pAVar2 = StaticSpace<asl::Array<char>_>::operator->(&(this->field_1)._s);
    Array<char>::resize(pAVar2,local_1c + 1);
    pAVar2 = StaticSpace<asl::Array<char>_>::operator->(&(this->field_1)._s);
    pcVar3 = Array<char>::data(pAVar2);
    memcpy(pcVar3,pcStack_18,(long)(local_1c + 1));
  }
  else if ((this->_type == SSTRING) && (local_1c < 8)) {
    memcpy(&this->field_1,pcStack_18,(long)(local_1c + 1));
  }
  else {
    free(this,x);
    if (local_1c < 8) {
      this->_type = SSTRING;
      memcpy(&this->field_1,pcStack_18,(long)(local_1c + 1));
    }
    else {
      this->_type = STRING;
      Array<char>::Array(&local_28,local_1c + 1);
      StaticSpace<asl::Array<char>_>::construct(&(this->field_1)._s,&local_28);
      Array<char>::~Array(&local_28);
      pAVar2 = StaticSpace<asl::Array<char>_>::operator->(&(this->field_1)._s);
      pcVar3 = Array<char>::data(pAVar2);
      memcpy(pcVar3,pcStack_18,(long)(local_1c + 1));
    }
  }
  return;
}

Assistant:

void Var::operator=(const char* x)
{
	int n = (int)strlen(x);
	if (_type == STRING) {
		_s->resize(n + 1);
		memcpy(_s->data(), x, n + 1);
	}
	else if(_type==SSTRING && n < VAR_SSPACE)
		memcpy(_ss, x, n + 1);
	else
	{
		free();
		if(n < VAR_SSPACE)
		{
			_type = SSTRING;
			memcpy(_ss, x, n + 1);
		}
		else
		{
			_type=STRING;
			NEW_STRINGC(_s, n + 1);
			memcpy(_s->data(), x, n + 1);
		}
	}
}